

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::paintEvent(DateTimePicker *this,QPaintEvent *param_1)

{
  ColorGroup CVar1;
  Section *pSVar2;
  long *plVar3;
  DateTimePickerPrivate *pDVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  QPainter p;
  QRect r;
  QStyleOption opt;
  QPainter aQStack_88 [8];
  QRect local_80;
  QStyleOption local_70 [64];
  
  pDVar4 = (this->d).d;
  if (0 < (pDVar4->super_DateTimeParser).sections.d.size) {
    lVar7 = 0;
    do {
      DateTimePickerPrivate::normalizeOffset(pDVar4,(int)lVar7);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pDVar4->super_DateTimeParser).sections.d.size);
  }
  QStyleOption::QStyleOption(local_70,1,0);
  QStyleOption::initFrom((QWidget *)local_70);
  QPainter::QPainter(aQStack_88,(QPaintDevice *)&this->field_0x10);
  pDVar4 = (this->d).d;
  if (0 < (pDVar4->super_DateTimeParser).sections.d.size) {
    pSVar2 = (pDVar4->super_DateTimeParser).sections.d.ptr;
    lVar6 = 0;
    lVar7 = 8;
    iVar5 = 0;
    do {
      local_80.y1 = 0;
      local_80.x2 = *(int *)((long)&pSVar2->type + lVar7) + iVar5 + -1;
      local_80.y2 = pDVar4->widgetHeight + -1;
      local_80.x1 = iVar5;
      CVar1 = QWidget::palette();
      plVar3 = (long *)QPalette::brush(CVar1,Dark);
      drawCylinder(aQStack_88,&local_80,(QColor *)(*plVar3 + 8),lVar6 == 0,
                   lVar6 == (((this->d).d)->super_DateTimeParser).sections.d.size + -1);
      DateTimePickerPrivate::drawSectionItems((this->d).d,(int)lVar6,aQStack_88,local_70);
      pDVar4 = (this->d).d;
      pSVar2 = (pDVar4->super_DateTimeParser).sections.d.ptr;
      iVar5 = iVar5 + *(int *)((long)&pSVar2->type + lVar7);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x30;
    } while (lVar6 < (pDVar4->super_DateTimeParser).sections.d.size);
  }
  DateTimePickerPrivate::drawWindow(pDVar4,aQStack_88,local_70);
  QPainter::~QPainter(aQStack_88);
  QStyleOption::~QStyleOption(local_70);
  return;
}

Assistant:

void
DateTimePicker::paintEvent( QPaintEvent * )
{
	d->normalizeOffsets();

	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	int x = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		const QRect r( x, 0, d->sections.at( i ).sectionWidth, d->widgetHeight );

		drawCylinder( &p, r, palette().color( QPalette::Dark ),
			( i == 0 ), ( i == d->sections.size() - 1 ) );

		d->drawSectionItems( i, &p, opt );

		x += d->sections.at( i ).sectionWidth;
	}

	d->drawWindow( &p, opt );
}